

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManComputeCuts(Aig_Man_t *p,int Num,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar4;
  void *Entry;
  abctime aVar5;
  abctime clk;
  int local_48;
  int nVol;
  int k;
  int i;
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *vLower;
  Vec_Ptr_t *vMinCut;
  Vec_Ptr_t *vResult;
  int nVolMax;
  int fVeryVerbose_local;
  int fVerbose_local;
  int Num_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManNodeNum(p);
  vLower = (Vec_Ptr_t *)0x0;
  aVar3 = Abc_Clock();
  p_00 = Vec_PtrAlloc(100);
  pVVar4 = Llb_ManComputeCutLo(p);
  Vec_PtrPush(p_00,pVVar4);
  pVVar4 = Llb_ManComputeCutLi(p);
  Vec_PtrPush(p_00,pVVar4);
  do {
    vUpper = (Vec_Ptr_t *)Vec_PtrEntry(p_00,0);
    for (nVol = 1; iVar2 = Vec_PtrSize(p_00), nVol < iVar2; nVol = nVol + 1) {
      pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,nVol);
      iVar2 = Llb_ManCutVolume(p,vUpper,pVVar4);
      if (iVar1 / Num < iVar2) {
        if (fVeryVerbose != 0) {
          Llb_ManCutPrint(p,vUpper,pVVar4);
        }
        vLower = Llb_ManFlowFindBestCut(p,vUpper,pVVar4,Num);
        if (vLower != (Vec_Ptr_t *)0x0) {
          if (fVeryVerbose != 0) {
            Llb_ManCutPrint(p,vLower,pVVar4);
            Llb_ManCutPrint(p,vUpper,vLower);
            printf("\n");
          }
          break;
        }
        if (fVeryVerbose != 0) {
          printf("Could not break the cut.\n");
          printf("\n");
        }
      }
      vUpper = pVVar4;
    }
    iVar2 = Vec_PtrSize(p_00);
    if (nVol == iVar2) {
      if (fVerbose != 0) {
        iVar1 = Vec_PtrSize(p_00);
        printf("Finished computing %d partitions.  ",(ulong)(iVar1 - 1));
        aVar5 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar5 - aVar3);
        Llb_ManResultPrint(p,p_00);
      }
      return p_00;
    }
    Vec_PtrPush(p_00,(void *)0x0);
    iVar2 = Vec_PtrSize(p_00);
    while (local_48 = iVar2 + -1, nVol < local_48) {
      Entry = Vec_PtrEntry(p_00,iVar2 + -2);
      Vec_PtrWriteEntry(p_00,local_48,Entry);
      iVar2 = local_48;
    }
    Vec_PtrWriteEntry(p_00,nVol,vLower);
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose )
{
    int nVolMax = Aig_ManNodeNum(p) / Num;
    Vec_Ptr_t * vResult, * vMinCut = NULL, * vLower, * vUpper;
    int i, k, nVol;
    abctime clk = Abc_Clock();
    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vResult, Llb_ManComputeCutLo(p) );
    Vec_PtrPush( vResult, Llb_ManComputeCutLi(p) );
    while ( 1 ) 
    {
        // find a place to insert new cut
        vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
        Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
        {
            nVol = Llb_ManCutVolume( p, vLower, vUpper );
            if ( nVol <= nVolMax )
            {
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vUpper );
            vMinCut = Llb_ManFlowFindBestCut( p, vLower, vUpper, Num );
            if ( vMinCut == NULL )
            {
                if ( fVeryVerbose )
                printf( "Could not break the cut.\n" );
                if ( fVeryVerbose )
                printf( "\n" );
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vMinCut, vUpper );
            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vMinCut );
            if ( fVeryVerbose )
            printf( "\n" );

            break;
        }
        if ( i == Vec_PtrSize(vResult) )
            break;
        // insert vMinCut before vUpper
        Vec_PtrPush( vResult, NULL );
        for ( k = Vec_PtrSize(vResult) - 1; k > i; k-- )
            Vec_PtrWriteEntry( vResult, k, Vec_PtrEntry(vResult, k-1) );
        Vec_PtrWriteEntry( vResult, i, vMinCut );
    }
    if ( fVerbose )
    {
        printf( "Finished computing %d partitions.  ", Vec_PtrSize(vResult) - 1 );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        Llb_ManResultPrint( p, vResult );
    }
    return vResult;
}